

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O2

double __thiscall agg::bspline::get(bspline *this,double x)

{
  double *__base;
  size_t in_RCX;
  void *__key;
  __compar_fn_t in_R8;
  double dVar1;
  int i;
  int local_14;
  
  __key = (void *)(long)this->m_num;
  dVar1 = 0.0;
  if (2 < (long)__key) {
    __base = this->m_x;
    if (*__base <= x) {
      if (__base[(long)__key + -1] <= x) {
        dVar1 = extrapolation_right(this,x);
      }
      else {
        bsearch(__key,__base,(size_t)&local_14,in_RCX,in_R8);
        dVar1 = interpolation(this,x,local_14);
      }
    }
    else {
      dVar1 = extrapolation_left(this,x);
    }
  }
  return dVar1;
}

Assistant:

double bspline::get(double x) const
    {
        if(m_num > 2)
        {
            int i;

            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            // Interpolation
            bsearch(m_num, m_x, x, &i);
            return interpolation(x, i);
        }
        return 0.0;
    }